

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildLogicalOp(int nToken,CNscPStackEntry *pLhs,CNscPStackEntry *pRhs)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  uchar *__src;
  size_t nSize;
  CNscContext *pCVar3;
  int iVar4;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar5;
  CNwnDoubleLinkList *pNext;
  char *pcVar6;
  NscPCode nCode;
  uint nValue;
  uint uVar7;
  uint uVar8;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar3 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pLhs != (CNscPStackEntry *)0x0) {
      pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar2 = (CNscPStackEntry *)(pLhs->m_link).m_pNext;
      if (pCVar2 != pLhs) {
        pCVar5 = (pLhs->m_link).m_pPrev;
        (pCVar2->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
        (pLhs->m_link).m_pNext = &pLhs->m_link;
        (pLhs->m_link).m_pPrev = &pLhs->m_link;
      }
      pCVar5 = &pCVar3->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pLhs) {
        pCVar5 = pCVar1;
      }
      pCVar1 = pCVar5->m_pNext;
      (pLhs->m_link).m_pNext = pCVar1;
      (pLhs->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pLhs->m_link;
      pCVar1->m_pPrev = &pLhs->m_link;
    }
    pCVar3 = g_pCtx;
    if (pRhs != (CNscPStackEntry *)0x0) {
      pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar2 = (CNscPStackEntry *)(pRhs->m_link).m_pNext;
      if (pCVar2 != pRhs) {
        pCVar5 = (pRhs->m_link).m_pPrev;
        (pCVar2->m_link).m_pPrev = pCVar5;
        pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
        (pRhs->m_link).m_pNext = &pRhs->m_link;
        (pRhs->m_link).m_pPrev = &pRhs->m_link;
      }
      pCVar5 = &pCVar3->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pRhs) {
        pCVar5 = pCVar1;
      }
      pCVar1 = pCVar5->m_pNext;
      (pRhs->m_link).m_pNext = pCVar1;
      (pRhs->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = &pRhs->m_link;
      pCVar1->m_pPrev = &pRhs->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
    goto LAB_0015133f;
  }
  if (pLhs == (CNscPStackEntry *)0x0) {
    __assert_fail("pLhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x107c,
                  "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (pRhs == (CNscPStackEntry *)0x0) {
    __assert_fail("pRhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x107d,
                  "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (pLhs->m_nType != NscType_Error && pRhs->m_nType != NscType_Error) {
    if (nToken == 0x118) {
      nCode = NscPCode_LogicalAND;
      pcVar6 = "&&";
    }
    else {
      if (nToken != 0x119) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                      ,0x10a0,
                      "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)"
                     );
      }
      nCode = NscPCode_LogicalOR;
      pcVar6 = "||";
    }
    if (pRhs->m_nType == NscType_Integer && pLhs->m_nType == NscType_Integer) {
      uVar8 = 0xffffffff;
      uVar7 = 0xffffffff;
      nValue = 0xffffffff;
      if (g_pCtx->m_fOptExpression == true) {
        uVar7 = uVar8;
        if (((pLhs->m_nDataSize != 0) && (*(size_t *)pLhs->m_pauchData == pLhs->m_nDataSize)) &&
           ((int)*(size_t *)((long)pLhs->m_pauchData + 8) == 0x34)) {
          iVar4 = CNscPStackEntry::GetInteger(pLhs);
          uVar7 = (uint)(iVar4 != 0);
        }
        nValue = 0xffffffff;
        if (((pRhs->m_nDataSize != 0) && (*(size_t *)pRhs->m_pauchData == pRhs->m_nDataSize)) &&
           ((int)*(size_t *)((long)pRhs->m_pauchData + 8) == 0x34)) {
          iVar4 = CNscPStackEntry::GetInteger(pRhs);
          nValue = (uint)(iVar4 != 0);
        }
      }
      if (uVar7 == 0xffffffff) {
        CNscPStackEntry::PushLogicalOp
                  (this,nCode,pLhs->m_pauchData,pLhs->m_nDataSize,pRhs->m_pauchData,
                   pRhs->m_nDataSize);
      }
      else {
        if ((nToken == 0x118) && (uVar7 == 0)) {
          nValue = 0;
        }
        else if ((nToken == 0x119) && (uVar7 == 1)) {
          nValue = 1;
        }
        else if (nValue == 0xffffffff) {
          __src = pRhs->m_pauchData;
          nSize = pRhs->m_nDataSize;
          CNscPStackEntry::MakeRoom(this,nSize);
          memcpy(this->m_pauchData + this->m_nDataSize,__src,nSize);
          this->m_nDataSize = this->m_nDataSize + nSize;
          goto LAB_00151267;
        }
        CNscPStackEntry::PushConstantInteger(this,nValue);
      }
LAB_00151267:
      if (this->m_nType != NscType_Unknown) goto LAB_0015133f;
      this->m_nType = NscType_Integer;
      goto LAB_00151278;
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar6);
  }
  if (this->m_nType != NscType_Unknown) {
LAB_0015133f:
    __assert_fail("m_nType == NscType_Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0xee,"void CNscPStackEntry::SetType(NscType)");
  }
  this->m_nType = NscType_Error;
LAB_00151278:
  pCVar3 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pLhs->m_link).m_pNext;
  if (pCVar2 != pLhs) {
    pCVar5 = (pLhs->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pLhs->m_link).m_pNext = &pLhs->m_link;
    (pLhs->m_link).m_pPrev = &pLhs->m_link;
  }
  pCVar5 = &pCVar3->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pLhs) {
    pCVar5 = pCVar1;
  }
  pCVar1 = pCVar5->m_pNext;
  (pLhs->m_link).m_pNext = pCVar1;
  (pLhs->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pLhs->m_link;
  pCVar1->m_pPrev = &pLhs->m_link;
  pCVar3 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pRhs->m_link).m_pNext;
  if (pCVar2 != pRhs) {
    pCVar5 = (pRhs->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pRhs->m_link).m_pNext = &pRhs->m_link;
    (pRhs->m_link).m_pPrev = &pRhs->m_link;
  }
  pCVar5 = &pCVar3->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pRhs) {
    pCVar5 = pCVar1;
  }
  pCVar1 = pCVar5->m_pNext;
  (pRhs->m_link).m_pNext = pCVar1;
  (pRhs->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pRhs->m_link;
  pCVar1->m_pPrev = &pRhs->m_link;
  return this;
}

Assistant:

YYSTYPE NscBuildLogicalOp (int nToken, YYSTYPE pLhs, YYSTYPE pRhs)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pLhs)
			g_pCtx ->FreePStackEntry (pLhs);
		if (pRhs)
			g_pCtx ->FreePStackEntry (pRhs);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Check for an error
	//

	assert (pLhs);
	assert (pRhs);
	NscType nLhsType = pLhs ->GetType ();
	NscType nRhsType = pRhs ->GetType ();
	if (nLhsType == NscType_Error || nRhsType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Get operator information
		//

		const char *pszOp;
		NscPCode nOp;
		if (nToken == ANDAND)
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
		}
		else if (nToken == OROR)
		{
			pszOp = "||";
			nOp = NscPCode_LogicalOR;
		}
		else
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
			assert (false);
		}

		//
		// Process the operator
		//

		if (nLhsType == NscType_Integer && nRhsType == NscType_Integer)
		{

			//
			// Get the constant value of the left and right side
			//

			int nLhsConstant = -1;
			int nRhsConstant = -1;
			if (g_pCtx ->GetOptExpression ())
			{
				if (pLhs ->IsSimpleConstant ())
					nLhsConstant = pLhs ->GetInteger () != 0 ? 1 : 0;
				if (pRhs ->IsSimpleConstant ())
					nRhsConstant = pRhs ->GetInteger () != 0 ? 1 : 0;
			}

			//
			// If the left side is not constant
			//

			if (nLhsConstant == -1)
			{
				pOut ->PushLogicalOp (nOp, 
					pLhs ->GetData (), pLhs ->GetDataSize (),
					pRhs ->GetData (), pRhs ->GetDataSize ());
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the lhs
			//

			else if (nToken == ANDAND && nLhsConstant == 0)
			{
				pOut ->PushConstantInteger (0);
				pOut ->SetType (NscType_Integer);
			}
			else if (nToken == OROR && nLhsConstant == 1)
			{
				pOut ->PushConstantInteger (1);
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the rhs
			//

			else if (nRhsConstant != -1)
			{
				pOut ->PushConstantInteger (nRhsConstant);
				pOut ->SetType (NscType_Integer);
			}

			//
			// Otherwise, just use the rhs
			//

			else
			{
				pOut ->AppendData (pRhs);
				pOut ->SetType (NscType_Integer);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, pszOp);
			pOut ->SetType (NscType_Error);
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pLhs);
    g_pCtx ->FreePStackEntry (pRhs);
	return pOut;
}